

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<unsigned_long> * __thiscall
testing::internal::MatcherBase<unsigned_long>::operator=
          (MatcherBase<unsigned_long> *this,MatcherBase<unsigned_long> *other)

{
  MatcherBase<unsigned_long> *other_local;
  MatcherBase<unsigned_long> *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }